

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O0

void ns_call(ns_connection *nc,int ev,void *p)

{
  int local_28;
  int len;
  void *p_local;
  int ev_local;
  ns_connection *nc_local;
  
  if ((nc->mgr->hexdump_file != (char *)0x0) && (ev != 0)) {
    if ((ev == 3) || (ev == 4)) {
      local_28 = *p;
    }
    else {
      local_28 = 0;
    }
    hexdump(nc,nc->mgr->hexdump_file,local_28,ev);
  }
  (*nc->callback)(nc,ev,p);
  return;
}

Assistant:

static void ns_call(struct ns_connection *nc, int ev, void *p) {
  if (nc->mgr->hexdump_file != NULL && ev != NS_POLL) {
    int len = (ev == NS_RECV || ev == NS_SEND) ? * (int *) p : 0;
    hexdump(nc, nc->mgr->hexdump_file, len, ev);
  }

  nc->callback(nc, ev, p);
}